

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall CField::step(CField *this,pos_t *b,SState *s,path_t *path)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  long lVar5;
  EPriority EVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  priority_list_t *ppVar9;
  _List_node_base *p_Var10;
  int iVar11;
  int iVar12;
  long lVar13;
  value_type local_60;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  allocator<char> local_31;
  
  ppVar9 = &this->prio;
  if (s->inverted != false) {
    ppVar9 = &this->inv_prio;
  }
  p_Var10 = (ppVar9->super__List_base<CField::EPriority,_std::allocator<CField::EPriority>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  EVar6 = s->direction;
  iVar1 = b->first;
  iVar2 = b->second;
  pvVar4 = (this->field).
           super__Vector_base<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    iVar12 = iVar2;
    iVar11 = iVar1;
    switch(EVar6) {
    case EP_SOUTH:
      iVar12 = iVar2 + 1;
      break;
    case EP_EAST:
      iVar11 = iVar1 + 1;
      break;
    case EP_NORTH:
      iVar12 = iVar2 + -1;
      break;
    case EP_WEST:
      iVar11 = iVar1 + -1;
    }
    lVar13 = (long)iVar12;
    iVar3 = *(int *)(*(long *)&pvVar4[iVar11].
                               super__Vector_base<CField::ECell,_std::allocator<CField::ECell>_>.
                               _M_impl.super__Vector_impl_data + lVar13 * 4);
    if ((iVar3 != 0x23) && ((iVar3 != 0x58 || ((s->drunken & 1U) != 0)))) break;
    EVar6 = *(EPriority *)&p_Var10[1]._M_next;
    p_Var10 = p_Var10->_M_next;
    s->direction = EVar6;
  }
  local_40 = path;
  switch(EVar6) {
  case EP_SOUTH:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"SOUTH",&local_31);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_40,&local_60);
    break;
  case EP_EAST:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"EAST",&local_31);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_40,&local_60);
    break;
  case EP_NORTH:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"NORTH",&local_31);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_40,&local_60);
    break;
  case EP_WEST:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"WEST",&local_31);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_40,&local_60);
    break;
  default:
    goto switchD_00106b93_default;
  }
  std::__cxx11::string::~string((string *)&local_60);
switchD_00106b93_default:
  b->first = iVar11;
  b->second = iVar12;
  lVar5 = *(long *)&(this->field).
                    super__Vector_base<std::vector<CField::ECell,_std::allocator<CField::ECell>_>,_std::allocator<std::vector<CField::ECell,_std::allocator<CField::ECell>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar11].
                    super__Vector_base<CField::ECell,_std::allocator<CField::ECell>_>._M_impl.
                    super__Vector_impl_data;
  iVar1 = *(int *)(lVar5 + lVar13 * 4);
  switch(iVar1) {
  case 0x4e:
    s->direction = EP_NORTH;
    break;
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x55:
  case 0x56:
    break;
  case 0x53:
    s->direction = EP_SOUTH;
    break;
  case 0x54:
    iVar7 = std::
            _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ::find(&(this->teleport)._M_t,b);
    if (&(this->teleport)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar7._M_node) {
      __assert_fail("teleport.end() != i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/bender/main.cpp"
                    ,0x140,"bool CField::step(pos_t &, SState &, path_t &)");
    }
    pmVar8 = std::
             map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             ::operator[](&this->teleport,b);
    b->first = pmVar8->first;
    b->second = pmVar8->second;
    break;
  case 0x57:
    s->direction = EP_WEST;
    break;
  case 0x58:
    if (s->drunken == true) {
      *(undefined4 *)(lVar5 + lVar13 * 4) = 0x20;
      return true;
    }
    break;
  default:
    if (iVar1 == 0x42) {
      s->drunken = (bool)(s->drunken ^ 1);
    }
    else if (iVar1 == 0x45) {
      s->direction = EP_EAST;
    }
    else {
      if (iVar1 != 0x49) {
        return false;
      }
      s->inverted = (bool)(s->inverted ^ 1);
    }
  }
  return false;
}

Assistant:

bool step(pos_t& b, SState& s, path_t& path)
        {
            bool result = false;
            bool step_taken = false;
            priority_list_t::const_iterator i = s.inverted ? inv_prio.begin() : prio.begin();
            
            do
            {
                int tx = b.first;
                int ty = b.second;
                
                switch (s.direction)
                {
                    case EP_EAST:
                        tx++;
                        break;
                        
                    case EP_NORTH:
                        ty--;
                        break;
                        
                    case EP_WEST:
                        tx--;
                        break;
                        
                    case EP_SOUTH:
                        ty++;
                        break;
                }
                if (EC_WALL == field[tx][ty]
                    || (EC_OBSTACLE == field[tx][ty] && !s.drunken))
                {
                    s.direction = *(i++);
                } else
                {
                    step_taken = true;
                    switch (s.direction)
                    {
                        case EP_EAST:
                            path.push_back("EAST");
                            break;
                            
                        case EP_NORTH:
                            path.push_back("NORTH");
                            break;
                            
                        case EP_WEST:
                            path.push_back("WEST");
                            break;
                            
                        case EP_SOUTH:
                            path.push_back("SOUTH");
                            break;
                    }
                    //std::cerr << path.back() << " (" << tx << ", " << ty << ")" << std::endl;
                    b = pos_t(tx, ty);
                    if (EC_OBSTACLE == field[tx][ty] && s.drunken)
                    {
                        field[tx][ty] = EC_NONE;
                        //s.drunken = false;
                        result = true;
                    }
                }
            } while (!step_taken);
            
            switch (field[b.first][b.second])
            {
                case EC_BEER:
                    s.drunken = !s.drunken;
                    break;
                    
                case EC_INVERTOR:
                    s.inverted = !s.inverted;
                    break;
                    
                case EC_TELEPORT:
                {
                    teleport_t::const_iterator i = teleport.find(b);
                    assert(teleport.end() != i);
                    b = teleport[b];
                    break;
                }
                    
                case EC_SOUTH:
                    s.direction = EP_SOUTH;
                    break;
                    
                case EC_EAST:
                    s.direction = EP_EAST;
                    break;
                    
                case EC_NORTH:
                    s.direction = EP_NORTH;
                    break;
                    
                case EC_WEST:
                    s.direction = EP_WEST;
                    break;

                default:
                    /* do nothing */;
            }
            return result;
        }